

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Modifier __Corrade__Utility__Debug__colorInternal<(Corrade::Utility::Debug::Color)6,false>___(void)

{
  _func_void_Debug_ptr *p_Var1;
  _lambda_Corrade__Utility__Debug___1_ local_9;
  
  p_Var1 = Corrade::Utility::Debug::colorInternal()::{lambda(Corrade::Utility::Debug&)#1}::
           operator_cast_to_function_pointer(&local_9);
  return p_Var1;
}

Assistant:

Debug::Modifier Debug::colorInternal() {
    return [](Debug& debug) {
        if(!debug._output || (debug._flags & Flag::DisableColors))
            return;

        debug._internalFlags |= InternalFlag::ColorWritten|InternalFlag::ValueWritten;
        #if defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_UTILITY_USE_ANSI_COLORS)
        HANDLE h = streamOutputHandle(debug._output);
        if(h != INVALID_HANDLE_VALUE) SetConsoleTextAttribute(h,
            (debug._previousColorAttributes & ~(FOREGROUND_BLUE|FOREGROUND_GREEN|FOREGROUND_RED|FOREGROUND_INTENSITY)) |
            char(c) |
            (bold ? FOREGROUND_INTENSITY : 0));
        #else
        debugGlobals.color = c;
        debugGlobals.colorBold = bold;
        debugGlobals.colorInverted = false;
        if(bold) {
            /* Adds an extra reset to also undo the inverse, if was set
               before */
            constexpr const char code[]{'\033', '[', '0', ';', '1' , ';', '3', '0' + char(c), 'm', '\0'};
            *debug._output << code;
        } else {
            /* This resets both bold and inverse */
            constexpr const char code[]{'\033', '[', '0', ';', '3', '0' + char(c), 'm', '\0'};
            *debug._output << code;
        }
        #endif
    };
}